

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeEquipment.cpp
# Opt level: O2

Watt __thiscall CompositeEquipment::Power(CompositeEquipment *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar4;
  
  iVar2 = (*(this->super_Equipment)._vptr_Equipment[7])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  puVar6 = (undefined8 *)*plVar4;
  iVar2 = 0;
  while( true ) {
    (*(code *)*puVar6)(plVar4);
    cVar1 = (**(code **)(*plVar4 + 0x10))(plVar4);
    if (cVar1 != '\0') break;
    plVar5 = (long *)(**(code **)(*plVar4 + 0x18))(plVar4);
    iVar3 = (**(code **)(*plVar5 + 0x10))(plVar5);
    iVar2 = iVar2 + iVar3;
    puVar6 = (undefined8 *)(*plVar4 + 8);
  }
  operator_delete(plVar4);
  return iVar2;
}

Assistant:

Watt CompositeEquipment::Power() {
    Iterator<Equipment*>* i = CreateIterator(); // ERRATUM: book had different iterator.
    Watt total = 0;

    for (i->First(); !i->IsDone(); i->Next()) {
        total += i->CurrentItem()->Power();
    }
    delete i;
    return total;
}